

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

void __thiscall
Time::Time::Time(Time *this,int year,int month,int dayOfMonth,int hour,int min,int sec)

{
  time_t tVar1;
  undefined1 local_60 [8];
  tm ekT;
  int min_local;
  int hour_local;
  int dayOfMonth_local;
  int month_local;
  int year_local;
  Time *this_local;
  
  this->_vptr_Time = (_func_int **)&PTR_getAsDate_0012ecd0;
  ekT.tm_zone._4_4_ = min;
  memset(local_60,0,0x38);
  local_60._4_4_ = ekT.tm_zone._4_4_;
  local_60._0_4_ = sec;
  ekT.tm_sec = hour;
  ekT.tm_min = dayOfMonth;
  ekT.tm_hour = month;
  ekT.tm_mday = year;
  tVar1 = timeGM((tm *)local_60);
  (this->timeSinceEpoch).tv_sec = tVar1;
  (this->timeSinceEpoch).tv_usec = 0;
  return;
}

Assistant:

Time::Time(const int year, const int month, const int dayOfMonth, const int hour, const int min, const int sec)
    {
#if defined(_WIN32) || defined(_POSIX)
        struct tm ekT = {0};
        ekT.tm_year = year;
        ekT.tm_mon = month;
        ekT.tm_mday = dayOfMonth;
        ekT.tm_hour = hour;
        ekT.tm_min = min;
        ekT.tm_sec = sec;
        timeSinceEpoch.tv_sec = timeGM(&ekT);
        timeSinceEpoch.tv_usec = 0;
#else
        timeSinceEpoch.tv_sec = 0;
        timeSinceEpoch.tv_usec = 0;
#endif
    }